

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int32 ma_rb_pointer_distance(ma_rb *pRB)

{
  int iVar1;
  
  if (pRB == (ma_rb *)0x0) {
    return 0;
  }
  iVar1 = (pRB->encodedWriteOffset & 0x7fffffff) - (pRB->encodedReadOffset & 0x7fffffff);
  if (-1 < (int)(pRB->encodedWriteOffset ^ pRB->encodedReadOffset)) {
    return iVar1;
  }
  return iVar1 + pRB->subbufferSizeInBytes;
}

Assistant:

MA_API ma_int32 ma_rb_pointer_distance(ma_rb* pRB)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;

    if (pRB == NULL) {
        return 0;
    }

    readOffset = c89atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = c89atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        return writeOffsetInBytes - readOffsetInBytes;
    } else {
        return writeOffsetInBytes + (pRB->subbufferSizeInBytes - readOffsetInBytes);
    }
}